

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void OptimizeHuffmanForRle(int length,size_t *counts)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *__s;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  long lVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  undefined4 *puVar15;
  int iVar17;
  undefined1 auVar16 [16];
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  
  puVar13 = counts + -1;
  if (-1 < length) {
    if (length != 0) {
      do {
        if (puVar13[(uint)length] != 0) goto LAB_001228b8;
        length = length - 1;
      } while (length != 0);
    }
    return;
  }
LAB_001228b8:
  uVar14 = (ulong)(uint)length;
  __s = malloc(uVar14 * 4);
  if (0 < length) {
    memset(__s,0,uVar14 * 4);
  }
  auVar19 = _DAT_0012a3b0;
  auVar3 = _DAT_0012a3a0;
  auVar2 = _DAT_0012a390;
  uVar12 = *counts;
  if (-1 < length) {
    puVar15 = (undefined4 *)((long)__s + -4);
    uVar8 = 0;
    uVar5 = 0;
    uVar9 = uVar12;
    do {
      if ((uVar8 == uVar14) || (counts[uVar8] != uVar9)) {
        if ((uVar9 == 0 && 4 < (int)uVar5) || (6 < (int)uVar5 && uVar9 != 0)) {
          uVar4 = (ulong)uVar5;
          if ((int)uVar5 < 2) {
            uVar4 = 1;
          }
          lVar11 = uVar4 - 1;
          auVar18._8_4_ = (int)lVar11;
          auVar18._0_8_ = lVar11;
          auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar18 = auVar18 ^ auVar19;
          uVar6 = 0;
          puVar7 = puVar15;
          auVar21 = auVar3;
          auVar22 = auVar2;
          do {
            auVar16 = auVar21 ^ auVar19;
            iVar20 = auVar18._4_4_;
            if ((bool)(~(auVar16._4_4_ == iVar20 && auVar18._0_4_ < auVar16._0_4_ ||
                        iVar20 < auVar16._4_4_) & 1)) {
              *puVar7 = 1;
            }
            if ((auVar16._12_4_ != auVar18._12_4_ || auVar16._8_4_ <= auVar18._8_4_) &&
                auVar16._12_4_ <= auVar18._12_4_) {
              *(undefined4 *)((long)__s + (uVar6 ^ 0x3ffffffffffffffe) * 4 + uVar8 * 4) = 1;
            }
            iVar17 = SUB164(auVar22 ^ auVar19,4);
            if (iVar17 <= iVar20 &&
                (iVar17 != iVar20 || SUB164(auVar22 ^ auVar19,0) <= auVar18._0_4_)) {
              *(undefined4 *)((long)__s + (uVar6 ^ 0x3ffffffffffffffd) * 4 + uVar8 * 4) = 1;
              *(undefined4 *)((long)__s + (uVar6 ^ 0x3ffffffffffffffc) * 4 + uVar8 * 4) = 1;
            }
            uVar6 = uVar6 + 4;
            lVar11 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 4;
            auVar21._8_8_ = lVar11 + 4;
            lVar11 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 4;
            auVar22._8_8_ = lVar11 + 4;
            puVar7 = puVar7 + -4;
          } while (((int)uVar4 + 3U & 0xfffffffc) != uVar6);
        }
        uVar5 = 1;
        if (uVar8 != uVar14) {
          uVar9 = counts[uVar8];
        }
      }
      else {
        uVar5 = uVar5 + 1;
      }
      uVar8 = uVar8 + 1;
      puVar15 = puVar15 + 1;
    } while (uVar8 != length + 1);
  }
  auVar3 = _DAT_0012a3b0;
  auVar2 = _DAT_0012a3a0;
  if (-1 < length) {
    uVar9 = 0;
    lVar11 = 0;
    uVar8 = 0;
    do {
      iVar20 = (int)uVar8;
      if ((uVar9 == uVar14) || (*(int *)((long)__s + uVar9 * 4) != 0)) {
LAB_00122b4a:
        if ((3 < iVar20) || ((iVar20 == 3 && (lVar11 == 0)))) {
          uVar12 = ((uVar8 >> 1) + lVar11) / uVar8;
          uVar4 = uVar12 & 0xffffffff;
          if ((int)uVar12 < 2) {
            uVar4 = 1;
          }
          if (lVar11 == 0) {
            uVar4 = 0;
          }
          lVar11 = uVar8 - 1;
          auVar16._8_4_ = (int)lVar11;
          auVar16._0_8_ = lVar11;
          auVar16._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar16 = auVar16 ^ auVar3;
          uVar12 = 0;
          puVar10 = puVar13;
          auVar19 = auVar2;
          do {
            auVar21 = auVar19 ^ auVar3;
            bVar1 = auVar16._0_4_ < auVar21._0_4_;
            iVar17 = auVar16._4_4_;
            iVar23 = auVar21._4_4_;
            if ((bool)(~(iVar17 < iVar23 || iVar23 == iVar17 && bVar1) & 1)) {
              *puVar10 = uVar4;
            }
            if (iVar17 >= iVar23 && (iVar23 != iVar17 || !bVar1)) {
              counts[uVar9 + (uVar12 ^ 0x1ffffffffffffffe)] = uVar4;
            }
            uVar12 = uVar12 + 2;
            lVar11 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 2;
            auVar19._8_8_ = lVar11 + 2;
            puVar10 = puVar10 + -2;
          } while ((iVar20 + 1U & 0xfffffffe) != uVar12);
        }
        if ((long)uVar9 < (long)(int)(length - 3)) {
          uVar12 = (counts + uVar9 + 2)[1] + (counts + uVar9)[1] + counts[uVar9 + 2] + counts[uVar9]
                   + 2 >> 2;
        }
        else {
          if (uVar14 <= uVar9) {
            iVar20 = 0;
            lVar11 = 0;
            uVar12 = 0;
            goto LAB_00122c51;
          }
          uVar12 = counts[uVar9];
        }
        iVar20 = 0;
        lVar11 = 0;
      }
      else {
        uVar4 = counts[uVar9];
        uVar6 = uVar12 - uVar4;
        if (uVar12 < uVar4) {
          uVar6 = -(uVar12 - uVar4);
        }
        if (3 < uVar6) goto LAB_00122b4a;
      }
LAB_00122c51:
      if (uVar9 != uVar14) {
        lVar11 = lVar11 + counts[uVar9];
      }
      uVar8 = (ulong)(iVar20 + 1);
      uVar9 = uVar9 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar9 != length + 1);
  }
  free(__s);
  return;
}

Assistant:

void OptimizeHuffmanForRle(int length, size_t* counts) {
  int i, k, stride;
  size_t symbol, sum, limit;
  int* good_for_rle;

  /* 1) We don't want to touch the trailing zeros. We may break the
  rules of the format by adding more data in the distance codes. */
  for (; length >= 0; --length) {
    if (length == 0) {
      return;
    }
    if (counts[length - 1] != 0) {
      /* Now counts[0..length - 1] does not have trailing zeros. */
      break;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
  with an rle code.*/
  good_for_rle = (int*)malloc((unsigned)length * sizeof(int));
  for (i = 0; i < length; ++i) good_for_rle[i] = 0;

  /* Let's not spoil any of the existing good rle codes.
  Mark any seq of 0's that is longer than 5 as a good_for_rle.
  Mark any seq of non-0's that is longer than 7 as a good_for_rle.*/
  symbol = counts[0];
  stride = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || counts[i] != symbol) {
      if ((symbol == 0 && stride >= 5) || (symbol != 0 && stride >= 7)) {
        for (k = 0; k < stride; ++k) {
          good_for_rle[i - k - 1] = 1;
        }
      }
      stride = 1;
      if (i != length) {
        symbol = counts[i];
      }
    } else {
      ++stride;
    }
  }

  /* 3) Let's replace those population counts that lead to more rle codes. */
  stride = 0;
  limit = counts[0];
  sum = 0;
  for (i = 0; i < length + 1; ++i) {
    if (i == length || good_for_rle[i]
        /* Heuristic for selecting the stride ranges to collapse. */
        || AbsDiff(counts[i], limit) >= 4) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        /* The stride must end, collapse what we have, if we have enough (4). */
        int count = (sum + stride / 2) / stride;
        if (count < 1) count = 1;
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
          that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 3) {
        /* All interesting strides have a count of at least 4,
        at least when non-zeros. */
        limit = (counts[i] + counts[i + 1] +
                 counts[i + 2] + counts[i + 3] + 2) / 4;
      } else if (i < length) {
        limit = counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
    }
  }

  free(good_for_rle);
}